

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

void __thiscall yactfr::internal::PktProc::buildRawProcFromShared(PktProc *this)

{
  _Hash_node_base *p_Var1;
  
  Proc::buildRawProcFromShared(&this->_preambleProc);
  for (p_Var1 = (this->_dsPktProcs)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    DsPktProc::buildRawProcFromShared((DsPktProc *)p_Var1[2]._M_nxt);
  }
  return;
}

Assistant:

void PktProc::buildRawProcFromShared()
{
    _preambleProc.buildRawProcFromShared();

    for (const auto& idDsPktProcPair : _dsPktProcs) {
        idDsPktProcPair.second->buildRawProcFromShared();
    }
}